

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_queue.h
# Opt level: O0

void b_queue_push(b_queue_t *p,uint Value)

{
  uint uVar1;
  uint Value_local;
  b_queue_t *p_local;
  
  if (p->size == p->cap) {
    if (p->i_first != p->i_empty) {
      __assert_fail("p->i_first == p->i_empty",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/b_queue.h"
                    ,0x30,"void b_queue_push(b_queue_t *, unsigned int)");
    }
    p->sum = p->sum - (ulong)p->data[p->i_first];
    p->i_first = (p->i_first + 1) % p->cap;
  }
  else {
    p->size = p->size + 1;
  }
  p->sum = (ulong)Value + p->sum;
  p->data[p->i_empty] = Value;
  uVar1 = p->i_empty + 1;
  p->i_empty = uVar1;
  if (uVar1 == p->cap) {
    p->i_empty = 0;
    p->i_first = 0;
  }
  return;
}

Assistant:

static inline void b_queue_push(b_queue_t *p, unsigned Value)
{
    if (p->size == p->cap) {
        assert(p->i_first == p->i_empty);
        p->sum -= p->data[p->i_first];
        p->i_first = (p->i_first + 1) % p->cap;
    } else
        p->size++;

    p->sum += Value;
    p->data[p->i_empty] = Value;
    if ((++p->i_empty) == p->cap) {
        p->i_empty = 0;
        p->i_first = 0;
    }
}